

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printT2AddrModeImm8s4OffsetOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  int iVar3;
  MCOperand *op;
  ulong uVar4;
  int32_t OffImm;
  MCOperand *MO1;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  uVar4 = MCOperand_getImm(op);
  iVar3 = (int)uVar4;
  SStream_concat0(O,", ");
  if (iVar3 == -0x80000000) {
    SStream_concat0(O,"#-0");
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar1 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
    }
  }
  else {
    if (iVar3 < 0) {
      if (iVar3 < -9) {
        SStream_concat(O,"#-0x%x",(ulong)(uint)-iVar3);
      }
      else {
        SStream_concat(O,"#-%u",(ulong)(uint)-iVar3);
      }
    }
    else if (iVar3 < 10) {
      SStream_concat(O,"#%u",uVar4 & 0xffffffff);
    }
    else {
      SStream_concat(O,"#0x%x",uVar4 & 0xffffffff);
    }
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar1 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      *(int *)(MI->flat_insn->detail->groups +
              (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = iVar3;
      pcVar2 = MI->flat_insn->detail;
      (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
    }
  }
  return;
}

Assistant:

static void printT2AddrModeImm8s4OffsetOperand(MCInst *MI,
		unsigned OpNum, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	int32_t OffImm = (int32_t)MCOperand_getImm(MO1);

	//assert(((OffImm & 0x3) == 0) && "Not a valid immediate!");

	SStream_concat0(O, ", ");
	if (OffImm == INT32_MIN) {
		SStream_concat0(O, "#-0");
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = 0;
			MI->flat_insn->detail->arm.op_count++;
		}
	} else {
		if (OffImm < 0) {
			if (OffImm < -HEX_THRESHOLD)
				SStream_concat(O, "#-0x%x", -OffImm);
			else
				SStream_concat(O, "#-%u", -OffImm);
		} else {
			if (OffImm > HEX_THRESHOLD)
				SStream_concat(O, "#0x%x", OffImm);
			else
				SStream_concat(O, "#%u", OffImm);
		}
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = OffImm;
			MI->flat_insn->detail->arm.op_count++;
		}
	}
}